

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O0

void __thiscall
adios2::query::BlockIndex<unsigned_char>::RunStatMinBlocksInfo
          (BlockIndex<unsigned_char> *this,QueryVar *query,MinVarInfo *MinBlocksInfo,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *hitBlocks)

{
  bool bVar1;
  Dims *start;
  size_type sVar2;
  reference pvVar3;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_RCX;
  long in_RDX;
  long *in_RDI;
  Box<adios2::Dims> box;
  size_type i;
  Dims cc;
  Dims ss;
  bool isHit;
  uchar bmax;
  uchar bmin;
  MinBlockInfo *blockInfo;
  const_iterator __end3;
  const_iterator __begin3;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *__range3;
  value_type *in_stack_fffffffffffffe88;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffe90;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffea0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea8;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffeb0;
  Dims *count;
  QueryVar *this_00;
  uchar *in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff10;
  RangeTree *in_stack_ffffffffffffff18;
  ulong local_a0;
  undefined1 local_91 [48];
  undefined1 local_61 [30];
  byte local_43;
  int8_t local_42;
  int8_t local_41;
  reference local_40;
  MinBlockInfo *local_38;
  __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
  local_30;
  long local_28;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *local_20;
  long local_18;
  
  local_28 = in_RDX + 0x20;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30._M_current =
       (MinBlockInfo *)
       std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::begin
                 ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                  in_stack_fffffffffffffe88);
  local_38 = (MinBlockInfo *)
             std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::end
                       ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                        in_stack_fffffffffffffe88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                             *)in_stack_fffffffffffffe90,
                            (__normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                             *)in_stack_fffffffffffffe88), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
               ::operator*(&local_30);
    local_41 = (local_40->MinMax).MinUnion.field_int8;
    local_42 = (local_40->MinMax).MaxUnion.field_int8;
    local_43 = RangeTree::CheckInterval<unsigned_char>
                         (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
    if ((bool)local_43) {
      if (*(int *)(*in_RDI + 0x40) == 5) {
        in_stack_fffffffffffffe90 = local_20;
        BlockHit::BlockHit((BlockHit *)local_20,(size_t)in_stack_fffffffffffffe88);
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::push_back
                  ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        BlockHit::~BlockHit((BlockHit *)0xd36bb1);
      }
      else {
        start = (Dims *)(long)*(int *)(local_18 + 0xc);
        this_00 = (QueryVar *)local_61;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xd36877);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&in_stack_fffffffffffffeb0->first,(size_type)in_stack_fffffffffffffea8,
                   (allocator_type *)in_stack_fffffffffffffea0);
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xd3689d);
        count = (Dims *)local_91;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xd368c0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&in_stack_fffffffffffffeb0->first,(size_type)in_stack_fffffffffffffea8,
                   (allocator_type *)in_stack_fffffffffffffea0);
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xd368e6);
        for (local_a0 = 0;
            sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (local_61 + 1)), local_a0 < sVar2; local_a0 = local_a0 + 1) {
          in_stack_fffffffffffffea8 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40->Start[local_a0];
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (local_61 + 1),local_a0);
          *pvVar3 = (value_type)in_stack_fffffffffffffea8;
          in_stack_fffffffffffffeb0 =
               (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)local_40->Count[local_a0];
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (local_91 + 1),local_a0);
          *pvVar3 = (value_type)in_stack_fffffffffffffeb0;
        }
        bVar1 = QueryVar::TouchSelection(this_00,start,count);
        if ((bVar1) && ((local_43 & 1) != 0)) {
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     &in_stack_fffffffffffffea0->first);
          in_stack_fffffffffffffea0 = local_20;
          BlockHit::BlockHit((BlockHit *)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8
                             ,local_20);
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::push_back
                    ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          BlockHit::~BlockHit((BlockHit *)0xd36aa5);
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~pair(in_stack_fffffffffffffe90);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (&in_stack_fffffffffffffea0->first);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (&in_stack_fffffffffffffea0->first);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void RunStatMinBlocksInfo(const QueryVar &query, const adios2::MinVarInfo *MinBlocksInfo,
                              std::vector<BlockHit> &hitBlocks)
    {
        for (auto &blockInfo : MinBlocksInfo->BlocksInfo)
        {
            T bmin = *(T *)&blockInfo.MinMax.MinUnion;
            T bmax = *(T *)&blockInfo.MinMax.MaxUnion;
            bool isHit = query.m_RangeTree.CheckInterval(bmin, bmax);

            if (!isHit)
                continue;

            if (m_VarPtr->m_ShapeID != adios2::ShapeID::LocalArray)
            {
                Dims ss(MinBlocksInfo->Dims);
                Dims cc(MinBlocksInfo->Dims);
                for (std::vector<int>::size_type i = 0; i < ss.size(); i++)
                {
                    ss[i] = blockInfo.Start[i];
                    cc[i] = blockInfo.Count[i];
                }
                if (!query.TouchSelection(ss, cc))
                    continue;

                if (isHit)
                {
                    adios2::Box<adios2::Dims> box = {ss, cc};
                    hitBlocks.push_back(BlockHit(blockInfo.BlockID, box));
                }
            }
            else
            { // local array
                hitBlocks.push_back(BlockHit(blockInfo.BlockID));
            }
        }
    }